

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O0

int If_CutMergeOrdered_(If_Man_t *p,If_Cut_t *pC0,If_Cut_t *pC1,If_Cut_t *pC)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint nVar;
  uint uVar5;
  int local_4c;
  uint local_48;
  int s;
  int c;
  int k;
  int i;
  int nLimit;
  int nSizeC1;
  int nSizeC0;
  If_Cut_t *pC_local;
  If_Cut_t *pC1_local;
  If_Cut_t *pC0_local;
  If_Man_t *p_local;
  
  uVar3 = *(uint *)&pC0->field_0x1c >> 0x18;
  uVar4 = *(uint *)&pC1->field_0x1c >> 0x18;
  nVar = *(uint *)&pC0->field_0x1c >> 0x10 & 0xff;
  if ((uVar3 == nVar) && (uVar4 == nVar)) {
    for (c = 0; c < (int)uVar3; c = c + 1) {
      if ((&pC0[1].Area)[c] != (&pC1[1].Area)[c]) {
        return 0;
      }
      p->pPerm[2][c] = c;
      p->pPerm[1][c] = c;
      p->pPerm[0][c] = c;
      (&pC[1].Area)[c] = (&pC0[1].Area)[c];
    }
    *(uint *)&pC->field_0x1c = *(uint *)&pC->field_0x1c & 0xffffff | nVar << 0x18;
    pC->uSign = pC0->uSign | pC1->uSign;
    uVar3 = Abc_InfoMask(nVar);
    p->uSharedMask = uVar3;
    p_local._4_4_ = 1;
  }
  else {
    local_4c = 0;
    local_48 = 0;
    s = 0;
    c = 0;
    p->uSharedMask = 0;
    uVar1 = local_48;
    iVar2 = s;
    if (uVar3 == 0) {
LAB_0042bebb:
      s = iVar2;
      local_48 = uVar1;
      if ((int)(nVar + s) < (int)(local_48 + uVar4)) {
        p_local._4_4_ = 0;
      }
      else {
        while (s < (int)uVar4) {
          p->pPerm[1][s] = local_48;
          (&pC[1].Area)[(int)local_48] = (&pC1[1].Area)[s];
          local_48 = local_48 + 1;
          s = s + 1;
        }
        *(uint *)&pC->field_0x1c = *(uint *)&pC->field_0x1c & 0xffffff | local_48 << 0x18;
        pC->uSign = pC0->uSign | pC1->uSign;
        if ((int)local_48 < 1) {
          __assert_fail("c > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifCut.c"
                        ,0x113,
                        "int If_CutMergeOrdered_(If_Man_t *, If_Cut_t *, If_Cut_t *, If_Cut_t *)");
        }
        p_local._4_4_ = 1;
      }
    }
    else if (uVar4 == 0) {
LAB_0042bdef:
      local_48 = uVar1;
      if ((int)(nVar + c) < (int)(local_48 + uVar3)) {
        p_local._4_4_ = 0;
      }
      else {
        while (c < (int)uVar3) {
          p->pPerm[0][c] = local_48;
          (&pC[1].Area)[(int)local_48] = (&pC0[1].Area)[c];
          local_48 = local_48 + 1;
          c = c + 1;
        }
        *(uint *)&pC->field_0x1c = *(uint *)&pC->field_0x1c & 0xffffff | local_48 << 0x18;
        pC->uSign = pC0->uSign | pC1->uSign;
        if ((int)local_48 < 1) {
          __assert_fail("c > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifCut.c"
                        ,0x107,
                        "int If_CutMergeOrdered_(If_Man_t *, If_Cut_t *, If_Cut_t *, If_Cut_t *)");
        }
        p_local._4_4_ = 1;
      }
    }
    else {
      for (; local_48 != nVar; local_48 = local_48 + 1) {
        if ((int)(&pC0[1].Area)[c] < (int)(&pC1[1].Area)[s]) {
          p->pPerm[0][c] = local_48;
          uVar5 = c + 1;
          (&pC[1].Area)[(int)local_48] = (&pC0[1].Area)[c];
          uVar1 = local_48 + 1;
          iVar2 = s;
          c = uVar5;
          if (uVar5 == uVar3) goto LAB_0042bebb;
        }
        else {
          if ((int)(&pC1[1].Area)[s] < (int)(&pC0[1].Area)[c]) {
            p->pPerm[1][s] = local_48;
            (&pC[1].Area)[(int)local_48] = (&pC1[1].Area)[s];
          }
          else {
            p->uSharedMask = 1 << ((byte)local_48 & 0x1f) | p->uSharedMask;
            p->pPerm[2][local_4c] = local_48;
            p->pPerm[1][s] = local_48;
            p->pPerm[0][c] = local_48;
            uVar5 = c + 1;
            (&pC[1].Area)[(int)local_48] = (&pC0[1].Area)[c];
            uVar1 = local_48 + 1;
            iVar2 = s + 1;
            local_4c = local_4c + 1;
            c = uVar5;
            if (uVar5 == uVar3) goto LAB_0042bebb;
          }
          uVar1 = local_48 + 1;
          if (s + 1U == uVar4) goto LAB_0042bdef;
          s = s + 1;
        }
      }
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

int If_CutMergeOrdered_( If_Man_t * p, If_Cut_t * pC0, If_Cut_t * pC1, If_Cut_t * pC )
{ 
    int nSizeC0 = pC0->nLeaves;
    int nSizeC1 = pC1->nLeaves;
    int nLimit  = pC0->nLimit;
    int i, k, c, s;

    // both cuts are the largest
    if ( nSizeC0 == nLimit && nSizeC1 == nLimit )
    {
        for ( i = 0; i < nSizeC0; i++ )
        {
            if ( pC0->pLeaves[i] != pC1->pLeaves[i] )
                return 0;
            p->pPerm[0][i] = p->pPerm[1][i] = p->pPerm[2][i] = i;
            pC->pLeaves[i] = pC0->pLeaves[i];
        }
        pC->nLeaves = nLimit;
        pC->uSign = pC0->uSign | pC1->uSign;
        p->uSharedMask = Abc_InfoMask( nLimit );
        return 1;
    }

    // compare two cuts with different numbers
    i = k = c = s = 0;
    p->uSharedMask = 0;
    if ( nSizeC0 == 0 ) goto FlushCut1;
    if ( nSizeC1 == 0 ) goto FlushCut0;
    while ( 1 )
    {
        if ( c == nLimit ) return 0;
        if ( pC0->pLeaves[i] < pC1->pLeaves[k] )
        {
            p->pPerm[0][i] = c;
            pC->pLeaves[c++] = pC0->pLeaves[i++];
            if ( i == nSizeC0 ) goto FlushCut1;
        }
        else if ( pC0->pLeaves[i] > pC1->pLeaves[k] )
        {
            p->pPerm[1][k] = c;
            pC->pLeaves[c++] = pC1->pLeaves[k++];
            if ( k == nSizeC1 ) goto FlushCut0;
        }
        else
        {
            p->uSharedMask |= (1 << c);
            p->pPerm[0][i] = p->pPerm[1][k] = p->pPerm[2][s++] = c;
            pC->pLeaves[c++] = pC0->pLeaves[i++]; k++;
            if ( i == nSizeC0 ) goto FlushCut1;
            if ( k == nSizeC1 ) goto FlushCut0;
        }
    }

FlushCut0:
    if ( c + nSizeC0 > nLimit + i ) return 0;
    while ( i < nSizeC0 )
    {
        p->pPerm[0][i] = c;
        pC->pLeaves[c++] = pC0->pLeaves[i++];
    }
    pC->nLeaves = c;
    pC->uSign = pC0->uSign | pC1->uSign;
    assert( c > 0 );
    return 1;

FlushCut1:
    if ( c + nSizeC1 > nLimit + k ) return 0;
    while ( k < nSizeC1 )
    {
        p->pPerm[1][k] = c;
        pC->pLeaves[c++] = pC1->pLeaves[k++];
    }
    pC->nLeaves = c;
    pC->uSign = pC0->uSign | pC1->uSign;
    assert( c > 0 );
    return 1;
}